

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

bool __thiscall
dxil_spv::CFGNode::post_dominates_any_work
          (CFGNode *this,CFGNode *parent,UnorderedSet<const_CFGNode_*> *node_cache)

{
  pointer ppCVar1;
  bool bVar2;
  size_type sVar3;
  pointer ppCVar4;
  bool bVar5;
  CFGNode *local_30;
  
  local_30 = parent;
  sVar3 = std::
          _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&node_cache->_M_h,&local_30);
  if (sVar3 == 0) {
    std::__detail::
    _Insert_base<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)node_cache,&local_30);
    if (((local_30->ir).operations.
         super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (local_30->ir).operations.
         super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       ((local_30->ir).phi.
        super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (local_30->ir).phi.
        super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      ppCVar4 = (local_30->pred).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppCVar1 = (local_30->pred).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      do {
        bVar5 = ppCVar4 == ppCVar1;
        bVar2 = !bVar5;
        if (bVar5) {
          return bVar2;
        }
        bVar5 = post_dominates_any_work(this,*ppCVar4,node_cache);
        ppCVar4 = ppCVar4 + 1;
      } while (!bVar5);
    }
    else {
      bVar2 = post_dominates(this,local_30);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool CFGNode::post_dominates_any_work(const CFGNode *parent, UnorderedSet<const CFGNode *> &node_cache) const
{
	// If we reached this node before and didn't terminate, it must have returned false.
	if (node_cache.count(parent))
		return false;
	node_cache.insert(parent);

	// This is not a dummy block, we have an answer.
	if (!parent->ir.operations.empty() || !parent->ir.phi.empty())
		return post_dominates(parent);

	for (auto *p : parent->pred)
		if (post_dominates_any_work(p, node_cache))
			return true;

	return false;
}